

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

GroupSizes __thiscall QLocaleData::groupSizes(QLocaleData *this)

{
  uint uVar1;
  bool bVar2;
  QSystemLocale *pQVar3;
  QMetaType fromType;
  undefined4 uVar4;
  anon_union_24_3_e3d07ef4_for_data *paVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  GroupSizes GVar8;
  QMetaType local_70;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this == &systemLocaleData) {
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = systemLocale();
    local_68.shared = (PrivateShared *)0x0;
    local_68._8_8_ = 0;
    local_68._16_8_ = 0;
    local_50 = 2;
    (*pQVar3->_vptr_QSystemLocale[2])(&local_48,pQVar3,3);
    ::QVariant::~QVariant((QVariant *)&local_68);
    paVar5 = &local_48;
    bVar2 = ::QVariant::isNull((QVariant *)paVar5);
    if (!bVar2) {
      local_70.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QLocaleData::GroupSizes>::metaType;
      local_68.shared = (PrivateShared *)((ulong)puStack_30 & 0xfffffffffffffffc);
      bVar2 = ::comparesEqual((QMetaType *)&local_68.shared,&local_70);
      if (bVar2) {
        if (((ulong)puStack_30 & 1) != 0) {
          paVar5 = (anon_union_24_3_e3d07ef4_for_data *)
                   ((long)&((local_48.shared)->ref).super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
                   (long)(local_48.shared)->offset);
        }
        local_68._8_4_ = *(undefined4 *)((long)paVar5 + 8);
        local_68.shared = (PrivateShared *)*(undefined8 *)paVar5;
      }
      else {
        local_68.shared = (PrivateShared *)0x0;
        local_68._8_8_ = (ulong)(uint)local_68._12_4_ << 0x20;
        paVar5 = &local_48;
        fromType = ::QVariant::metaType((QVariant *)paVar5);
        if (((ulong)puStack_30 & 1) != 0) {
          paVar5 = (anon_union_24_3_e3d07ef4_for_data *)
                   ((long)&((local_48.shared)->ref).super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
                   (long)(local_48.shared)->offset);
        }
        QMetaType::convert(fromType,paVar5,local_70,&local_68);
      }
      uVar6 = (uint)systemLocaleData._120_4_ >> 0xe & 3;
      if (0 < (int)(uint)local_68.shared) {
        uVar6 = (uint)local_68.shared;
      }
      uVar7 = (ulong)((uint)systemLocaleData._120_4_ >> 0x10 & 7);
      if ((int)((ulong)local_68._0_8_ >> 0x20) != 0 && -1 < (long)local_68.shared) {
        uVar7 = (ulong)local_68.shared >> 0x20;
      }
      uVar4 = (uint)systemLocaleData._120_4_ >> 0x13 & 7;
      if (0 < (int)local_68._8_4_) {
        uVar4 = local_68._8_4_;
      }
      ::QVariant::~QVariant((QVariant *)&local_48);
      goto LAB_00309263;
    }
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  uVar1 = *(uint *)&this->field_0x78;
  uVar6 = uVar1 >> 0xe & 3;
  uVar7 = (ulong)(uVar1 >> 0x10 & 7);
  uVar4 = uVar1 >> 0x13 & 7;
LAB_00309263:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    GVar8._0_8_ = (ulong)uVar6 | uVar7 << 0x20;
    GVar8.least = uVar4;
    return GVar8;
  }
  __stack_chk_fail();
}

Assistant:

QLocaleData::GroupSizes QLocaleData::groupSizes() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (this == &systemLocaleData) {
        QVariant queryResult = systemLocale()->query(QSystemLocale::Grouping);
        if (!queryResult.isNull()) {
            QLocaleData::GroupSizes sysGroupSizes =
                    queryResult.value<QLocaleData::GroupSizes>();
            if (sysGroupSizes.first <= 0)
                sysGroupSizes.first = m_grouping_first;
            if (sysGroupSizes.higher <= 0)
                sysGroupSizes.higher = m_grouping_higher;
            if (sysGroupSizes.least <= 0)
                sysGroupSizes.least = m_grouping_least;
            return sysGroupSizes;
        }
    }
#endif
    return { m_grouping_first,
             m_grouping_higher,
             m_grouping_least };
}